

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::H1V2ConvertFiltered(jpeg_decoder *this)

{
  int iVar1;
  byte bVar2;
  uint8 *puVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  char *__assertion;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  uint8 *puVar20;
  ulong uVar21;
  uint8 *local_48;
  
  uVar17 = this->m_image_y_size - this->m_total_lines_left;
  uVar9 = (this->m_image_y_size >> 1) - 1;
  puVar3 = this->m_pScan_line_0;
  uVar12 = (int)(uVar17 - 1) >> 1;
  if ((int)(uVar12 + 1) < (int)uVar9) {
    uVar9 = uVar12 + 1;
  }
  local_48 = this->m_pSample_buf;
  puVar20 = local_48;
  if ((-1 < (int)uVar12) &&
     (((uVar10 = uVar17 & 0xf, uVar10 == 0xf || (uVar10 == 0)) && (1 < this->m_total_lines_left))))
  {
    if ((int)uVar17 < 1) {
      __assert_fail("y > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x6f3,"void jpgd::jpeg_decoder::H1V2ConvertFiltered()");
    }
    if (this->m_sample_buf_prev_valid == false) {
      __assert_fail("m_sample_buf_prev_valid",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x6f4,"void jpgd::jpeg_decoder::H1V2ConvertFiltered()");
    }
    puVar20 = this->m_pSample_buf_prev;
    if (uVar10 == 0xf) {
      local_48 = puVar20;
    }
  }
  if (0 < this->m_image_x_size) {
    iVar1 = (uVar17 & 1) * 2 + 1;
    iVar15 = (uint)((uVar17 & 1) == 0) * 2 + 1;
    uVar10 = 0;
    lVar19 = 0;
    do {
      if ((uint)lVar19 == 0x4000000) {
        __assertion = "ofs >= 0";
        goto LAB_00150e79;
      }
      uVar7 = (uint)lVar19 & 7 | uVar10 & 0xffffff00;
      uVar16 = uVar7 | (uVar17 & 0xf) << 3;
      uVar13 = this->m_max_blocks_per_row * 0x40;
      if ((int)uVar13 <= (int)uVar16) {
LAB_00150e72:
        __assertion = "ofs < m_max_blocks_per_row * 64";
LAB_00150e79:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.h"
                      ,0x116,"int jpgd::jpeg_decoder::check_sample_buf_ofs(int) const");
      }
      uVar4 = (uVar12 & 7) << 3 | uVar7;
      uVar21 = (ulong)uVar4 | 0x80;
      if ((uVar13 <= (uint)uVar21) || (uVar6 = (ulong)uVar4 | 0xc0, uVar13 <= (uint)uVar6))
      goto LAB_00150e72;
      uVar5 = (ulong)(uVar7 | (uVar9 & 7) << 3);
      uVar18 = uVar5 | 0x80;
      if ((uVar13 <= (uint)uVar18) || (uVar5 = uVar5 | 0xc0, uVar13 <= (uint)uVar5))
      goto LAB_00150e72;
      bVar2 = local_48[uVar16];
      uVar6 = (ulong)((uint)puVar20[uVar6] * iVar1 + (uint)this->m_pSample_buf[uVar5] * iVar15 + 2 &
                     0xfffffffc);
      iVar14 = *(int *)((long)this->m_crr + uVar6) + (uint)bVar2;
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      if (0xfe < iVar14) {
        iVar14 = 0xff;
      }
      uVar21 = (ulong)((uint)puVar20[uVar21] * iVar1 + (uint)this->m_pSample_buf[uVar18] * iVar15 +
                       2 & 0xfffffffc);
      iVar11 = (*(int *)((long)this->m_cbg + uVar21) + *(int *)((long)this->m_crg + uVar6) >> 0x10)
               + (uint)bVar2;
      iVar8 = (uint)bVar2 + *(int *)((long)this->m_cbb + uVar21);
      puVar3[lVar19 * 4] = (uint8)iVar14;
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      puVar3[lVar19 * 4 + 1] = (uint8)iVar11;
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      if (0xfe < iVar8) {
        iVar8 = 0xff;
      }
      puVar3[lVar19 * 4 + 2] = (uint8)iVar8;
      puVar3[lVar19 * 4 + 3] = 0xff;
      lVar19 = lVar19 + 1;
      uVar10 = uVar10 + 0x20;
    } while ((int)lVar19 < this->m_image_x_size);
  }
  return;
}

Assistant:

void jpeg_decoder::H1V2ConvertFiltered()
	{
		const uint BLOCKS_PER_MCU = 4;
		int y = m_image_y_size - m_total_lines_left;
		int row = y & 15;

		const int half_image_y_size = (m_image_y_size >> 1) - 1;

		uint8* d0 = m_pScan_line_0;

		const int w0 = (row & 1) ? 3 : 1;
		const int w1 = (row & 1) ? 1 : 3;

		int c_y0 = (y - 1) >> 1;
		int c_y1 = JPGD_MIN(c_y0 + 1, half_image_y_size);

		const uint8_t* p_YSamples = m_pSample_buf;
		const uint8_t* p_C0Samples = m_pSample_buf;
		if ((c_y0 >= 0) && (((row & 15) == 0) || ((row & 15) == 15)) && (m_total_lines_left > 1))
		{
			assert(y > 0);
			assert(m_sample_buf_prev_valid);

			if ((row & 15) == 15)
				p_YSamples = m_pSample_buf_prev;

			p_C0Samples = m_pSample_buf_prev;
		}

		const int y_sample_base_ofs = ((row & 8) ? 64 : 0) + (row & 7) * 8;
		const int y0_base = (c_y0 & 7) * 8 + 128;
		const int y1_base = (c_y1 & 7) * 8 + 128;

		for (int x = 0; x < m_image_x_size; x++)
		{
			const int base_ofs = (x >> 3) * BLOCKS_PER_MCU * 64 + (x & 7);

			int y_sample = p_YSamples[check_sample_buf_ofs(base_ofs + y_sample_base_ofs)];

			int a = base_ofs + y0_base;
			int cb0_sample = p_C0Samples[check_sample_buf_ofs(a)];
			int cr0_sample = p_C0Samples[check_sample_buf_ofs(a + 64)];

			int b = base_ofs + y1_base;
			int cb1_sample = m_pSample_buf[check_sample_buf_ofs(b)];
			int cr1_sample = m_pSample_buf[check_sample_buf_ofs(b + 64)];

			int cb = (cb0_sample * w0 + cb1_sample * w1 + 2) >> 2;
			int cr = (cr0_sample * w0 + cr1_sample * w1 + 2) >> 2;

			int rc = m_crr[cr];
			int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
			int bc = m_cbb[cb];

			d0[0] = clamp(y_sample + rc);
			d0[1] = clamp(y_sample + gc);
			d0[2] = clamp(y_sample + bc);
			d0[3] = 255;

			d0 += 4;
		}
	}